

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_printers.hpp
# Opt level: O1

void iutest::detail::PrintToChar<wchar_t>(wchar_t value,iu_ostream *os)

{
  char cVar1;
  size_t i;
  long lVar2;
  size_t sVar3;
  ostream *poVar4;
  byte bVar5;
  int in_ECX;
  uint uVar6;
  char cVar7;
  wchar_t str [2];
  ulong local_58;
  undefined1 local_50;
  string local_48;
  
  if (value == L'\0') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\\0",2);
    return;
  }
  if (value < L' ') {
    std::__ostream_insert<char,std::char_traits<char>>(os,"0x",2);
    local_58 = 0;
    bVar5 = 0x1c;
    lVar2 = 0;
    do {
      uVar6 = value >> (bVar5 & 0x1f) & 0xf;
      cVar1 = (char)uVar6;
      cVar7 = cVar1 + '0';
      if (9 < uVar6) {
        cVar7 = cVar1 + '7';
      }
      *(char *)((long)&local_58 + lVar2) = cVar7;
      lVar2 = lVar2 + 1;
      bVar5 = bVar5 - 4;
    } while (lVar2 != 8);
    local_50 = 0;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    sVar3 = strlen((char *)&local_58);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_48,&local_58,(long)&local_58 + sVar3);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,local_48._M_dataplus._M_p,local_48._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
  }
  else {
    local_58 = (ulong)(uint)value;
    std::__ostream_insert<char,std::char_traits<char>>(os,"\'",1);
    AnyStringToMultiByteString_abi_cxx11_
              (&local_48,(detail *)&local_58,(wchar_t *)0xffffffff,in_ECX);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,local_48._M_dataplus._M_p,local_48._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\'",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p == &local_48.field_2) {
      return;
    }
  }
  operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

void PrintToChar(const T value, iu_ostream* os)
{
    // char or unsigned char の時に、 0 が NULL 文字にならないように修正
    if( value == 0 )
    {
        *os << "\\0";
    }
    else if( static_cast<int>(value) < 0x20 )
    {
        *os << "0x" << ToHexString(value);
    }
    else
    {
        const T str[2] = { value, 0 };
        *os << "\'" << detail::ShowAnyCString(str) << "\'";
    }
}